

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void parseThreeCommaList<double>(string *lst,double *a,double *b,double *c)

{
  runtime_error *this;
  vector<double,_std::allocator<double>_> vec;
  double v;
  string part;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  istringstream ss;
  int aiStack_310 [88];
  istringstream ssp;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)lst,_S_in);
  part._M_dataplus._M_p = (pointer)&part.field_2;
  part._M_string_length = 0;
  part.field_2._M_local_buf[0] = '\0';
  vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while (*(int *)((long)aiStack_310 + *(long *)(_ss + -0x18)) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&ss,(string *)&part,',');
    std::__cxx11::istringstream::istringstream((istringstream *)&ssp,(string *)&part,_S_in);
    std::istream::_M_extract<double>((double *)&ssp);
    std::vector<double,std::allocator<double>>::emplace_back<double&>
              ((vector<double,std::allocator<double>> *)&vec,&v);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ssp);
  }
  if ((long)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start == 0x18) {
    *a = *vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
    *b = vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[1];
    *c = vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[2];
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&vec.super__Vector_base<double,_std::allocator<double>_>);
    std::__cxx11::string::~string((string *)&part);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string
            (&local_370,
             (long)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_350,"Error: Input vector was ",&local_370);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssp,
                 &local_350,", expected 3.");
  std::runtime_error::runtime_error(this,(string *)&ssp);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parseThreeCommaList(std::string lst, T& a, T& b, T& c)
{
    std::istringstream ss(lst);
    std::string part;
    T v;
    std::vector<T> vec;
    while(ss.good()) {
        getline( ss, part, ',' );
//        vec.emplace_back(std::stoi(part));
        std::istringstream ssp(part);
        ssp >> v;
        vec.emplace_back(v);
    }

    if (vec.size() != 3)
        throw std::runtime_error("Error: Input vector was " + std::to_string(vec.size()) + ", expected 3.");

    a = vec[0];
    b = vec[1];
    c = vec[2];
}